

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManPrintStats(Fxch_Man_t *pFxchMan)

{
  uint uVar1;
  Fxch_Man_t *pFxchMan_local;
  
  uVar1 = Vec_WecSizeUsed(pFxchMan->vCubes);
  printf("Cubes =%8d  ",(ulong)uVar1);
  uVar1 = Vec_WecSizeUsed(pFxchMan->vLits);
  printf("Lits  =%8d  ",(ulong)uVar1);
  uVar1 = Hsh_VecSize(pFxchMan->pDivHash);
  printf("Divs  =%8d  ",(ulong)uVar1);
  uVar1 = Vec_QueSize(pFxchMan->vDivPrio);
  printf("Divs+ =%8d  ",(ulong)uVar1);
  printf("Extr  =%7d  \n",(ulong)(uint)pFxchMan->nExtDivs);
  return;
}

Assistant:

void Fxch_ManPrintStats( Fxch_Man_t* pFxchMan )
{
    printf( "Cubes =%8d  ", Vec_WecSizeUsed( pFxchMan->vCubes ) );
    printf( "Lits  =%8d  ", Vec_WecSizeUsed( pFxchMan->vLits ) );
    printf( "Divs  =%8d  ", Hsh_VecSize( pFxchMan->pDivHash ) );
    printf( "Divs+ =%8d  ", Vec_QueSize( pFxchMan->vDivPrio ) );
    printf( "Extr  =%7d  \n", pFxchMan->nExtDivs );
}